

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O1

int asn1_get_nonzero_mpi(uchar **p,uchar *end,mbedtls_mpi *X)

{
  int iVar1;
  int iVar2;
  
  iVar1 = mbedtls_asn1_get_mpi(p,end,X);
  if (iVar1 == 0) {
    iVar2 = mbedtls_mpi_cmp_int(X,0);
    iVar1 = -0x4080;
    if (iVar2 != 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int asn1_get_nonzero_mpi(unsigned char **p,
                                const unsigned char *end,
                                mbedtls_mpi *X)
{
    int ret;

    ret = mbedtls_asn1_get_mpi(p, end, X);
    if (ret != 0) {
        return ret;
    }

    if (mbedtls_mpi_cmp_int(X, 0) == 0) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    return 0;
}